

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86::forward_inplace(HardSigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  long lVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  undefined1 auVar15 [16];
  
  auVar6 = _DAT_00546640;
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar9 = 0;
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar9;
  }
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar10 = (undefined1 (*) [16])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
    lVar11 = 0;
    for (iVar13 = 0; iVar13 + 3 < iVar7; iVar13 = iVar13 + 4) {
      fVar2 = (this->super_HardSigmoid).beta;
      fVar14 = (this->super_HardSigmoid).alpha;
      auVar15._0_4_ = fVar14 * *(float *)*pauVar10 + fVar2;
      auVar15._4_4_ = fVar14 * *(float *)((long)*pauVar10 + 4) + fVar2;
      auVar15._8_4_ = fVar14 * *(float *)((long)*pauVar10 + 8) + fVar2;
      auVar15._12_4_ = fVar14 * *(float *)((long)*pauVar10 + 0xc) + fVar2;
      auVar15 = maxps(auVar15,ZEXT816(0));
      auVar15 = minps(auVar15,auVar6);
      *pauVar10 = auVar15;
      pauVar10 = pauVar10 + 1;
      lVar11 = lVar11 + 4;
    }
    lVar12 = sVar5 * sVar4 * uVar9;
    for (; (int)lVar11 < iVar7; lVar11 = lVar11 + 1) {
      fVar2 = *(float *)((long)pvVar3 + lVar11 * 4 + lVar12);
      fVar14 = 0.0;
      if (((this->super_HardSigmoid).lower <= fVar2) &&
         (pfVar1 = &(this->super_HardSigmoid).upper, fVar14 = 1.0,
         fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
        fVar14 = fVar2 * (this->super_HardSigmoid).alpha + (this->super_HardSigmoid).beta;
      }
      *(float *)((long)pvVar3 + lVar11 * 4 + lVar12) = fVar14;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}